

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O3

string * __thiscall minja::Value::to_str_abi_cxx11_(string *__return_storage_ptr__,Value *this)

{
  value_t vVar1;
  uint uVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  uint __len;
  ulong __val;
  
  vVar1 = (this->primitive_).m_data.m_type;
  if (vVar1 == string) {
    get<std::__cxx11::string>(__return_storage_ptr__,this);
  }
  else if ((byte)(vVar1 - number_integer) < 2) {
    uVar4 = get<long>(this);
    __val = -uVar4;
    if (0 < (long)uVar4) {
      __val = uVar4;
    }
    __len = 1;
    if (9 < __val) {
      uVar5 = __val;
      uVar2 = 4;
      do {
        __len = uVar2;
        if (uVar5 < 100) {
          __len = __len - 2;
          goto LAB_001ca415;
        }
        if (uVar5 < 1000) {
          __len = __len - 1;
          goto LAB_001ca415;
        }
        if (uVar5 < 10000) goto LAB_001ca415;
        bVar3 = 99999 < uVar5;
        uVar5 = uVar5 / 10000;
        uVar2 = __len + 4;
      } while (bVar3);
      __len = __len + 1;
    }
LAB_001ca415:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct
              ((ulong)__return_storage_ptr__,(char)__len - (char)((long)uVar4 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((__return_storage_ptr__->_M_dataplus)._M_p + -((long)uVar4 >> 0x3f),__len,__val);
  }
  else {
    if (vVar1 == boolean) {
      bVar3 = get<bool>(this);
      pcVar7 = "False";
      if (bVar3) {
        pcVar7 = "True";
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = pcVar7 + ((ulong)bVar3 ^ 5);
    }
    else {
      if (vVar1 == number_float) {
        get<double>(this);
        __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                  (__return_storage_ptr__,vsnprintf,0x148,"%f");
        return __return_storage_ptr__;
      }
      if ((((vVar1 != null) ||
           ((this->object_).
            super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != (element_type *)0x0)) ||
          ((this->array_).
           super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr != (element_type *)0x0)) ||
         ((this->callable_).
          super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (element_type *)0x0)) {
        dump_abi_cxx11_(__return_storage_ptr__,this,-1,false);
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar7 = "None";
      pcVar6 = "";
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar7,pcVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_str() const {
    if (is_string()) return get<std::string>();
    if (is_number_integer()) return std::to_string(get<int64_t>());
    if (is_number_float()) return std::to_string(get<double>());
    if (is_boolean()) return get<bool>() ? "True" : "False";
    if (is_null()) return "None";
    return dump();
  }